

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_get_rel_pos(ggml_context *ctx,ggml_tensor *a,int qh,int kh)

{
  ggml_tensor *pgVar1;
  ggml_type in_ECX;
  ggml_type in_EDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  int64_t ne [4];
  int in_stack_ffffffffffffffb8;
  ggml_context *in_stack_ffffffffffffffc0;
  
  if (in_EDX != in_ECX) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1239,"GGML_ASSERT(%s) failed","qh == kh");
  }
  if ((int)in_ECX < (int)in_EDX) {
    in_ECX = in_EDX;
  }
  if ((long)(int)(in_ECX * 2 + -1) == in_RSI->ne[1]) {
    pgVar1 = ggml_new_tensor(in_stack_ffffffffffffffc0,in_ECX,in_stack_ffffffffffffffb8,
                             (int64_t *)0x152948);
    pgVar1->op = GGML_OP_GET_REL_POS;
    pgVar1->src[0] = in_RSI;
    return pgVar1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x123a,
             "GGML_ASSERT(%s) failed","2*MAX(qh, kh) - 1 == a->ne[1]");
}

Assistant:

struct ggml_tensor * ggml_get_rel_pos(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   qh,
        int                   kh) {
    GGML_ASSERT(qh == kh);
    GGML_ASSERT(2*MAX(qh, kh) - 1 == a->ne[1]);

    const int64_t ne[4] = { a->ne[0], kh, qh, 1, };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F16, 3, ne);

    result->op     = GGML_OP_GET_REL_POS;
    result->src[0] = a;

    return result;
}